

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteEqn.c
# Opt level: O1

void Io_WriteEqn(Abc_Ntk_t *pNtk,char *pFileName)

{
  Abc_Obj_t *pAVar1;
  long *plVar2;
  void *__ptr;
  bool bVar3;
  uint uVar4;
  byte *__s;
  size_t sVar5;
  FILE *__stream;
  char *pcVar6;
  char *pcVar7;
  Vec_Vec_t *vLevels;
  void **ppvVar8;
  ProgressBar *p;
  Vec_Ptr_t *pVVar9;
  Hop_Obj_t *pHVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  bool bVar18;
  bool bVar19;
  
  if ((pNtk->ntkFunc != ABC_FUNC_AIG) || (pNtk->ntkType != ABC_NTK_NETLIST)) {
    __assert_fail("Abc_NtkIsAigNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioWriteEqn.c"
                  ,0x36,"void Io_WriteEqn(Abc_Ntk_t *, char *)");
  }
  if (0 < pNtk->nObjCounts[8]) {
    puts("Warning: only combinational portion is being written.");
  }
  pVVar9 = pNtk->vObjs;
  if (pVVar9->nSize < 1) {
    uVar16 = 0;
    __s = (byte *)0x0;
    bVar3 = false;
  }
  else {
    bVar3 = true;
    uVar16 = 0;
    __s = (byte *)0x0;
    do {
      if (pVVar9->pArray[uVar16] != (void *)0x0) {
        __s = (byte *)Nm_ManFindNameById(pNtk->pManName,(int)uVar16);
        if (__s == (byte *)0x0) {
          __s = (byte *)0x0;
        }
        else {
          sVar5 = strlen((char *)__s);
          if ((*__s & 0xfe) == 0x30) {
            bVar3 = false;
            break;
          }
          uVar4 = (uint)sVar5;
          bVar18 = 0 < (int)uVar4;
          if (0 < (int)uVar4) {
            bVar18 = true;
            uVar12 = 1;
            do {
              if (((ulong)__s[uVar12 - 1] < 0x2c) &&
                 ((0xf0200000000U >> ((ulong)__s[uVar12 - 1] & 0x3f) & 1) != 0)) {
                bVar3 = false;
                break;
              }
              bVar18 = uVar12 < (uVar4 & 0x7fffffff);
              bVar19 = uVar12 != (uVar4 & 0x7fffffff);
              uVar12 = uVar12 + 1;
            } while (bVar19);
          }
          if (bVar18) break;
        }
      }
      uVar16 = uVar16 + 1;
      pVVar9 = pNtk->vObjs;
    } while ((long)uVar16 < (long)pVVar9->nSize);
    bVar3 = !bVar3;
  }
  if (bVar3) {
    printf("The network cannot be written in the EQN format because object %d has name \"%s\".\n",
           uVar16 & 0xffffffff,__s);
    puts("Consider renaming the objects using command \"short_names\" and trying again.");
    return;
  }
  __stream = fopen(pFileName,"w");
  if (__stream == (FILE *)0x0) {
    fprintf(_stdout,"Io_WriteEqn(): Cannot open the output file \"%s\".\n",pFileName);
    return;
  }
  pcVar7 = pNtk->pName;
  pcVar6 = Extra_TimeStamp();
  fprintf(__stream,"# Equations for \"%s\" written by ABC on %s\n",pcVar7,pcVar6);
  fwrite("INORDER =",9,1,__stream);
  pVVar9 = pNtk->vCis;
  if (0 < pVVar9->nSize) {
    iVar17 = 9;
    lVar13 = 0;
    iVar15 = 0;
    do {
      pAVar1 = *(Abc_Obj_t **)
                (*(long *)(*(long *)(*pVVar9->pArray[lVar13] + 0x20) + 8) +
                (long)**(int **)((long)pVVar9->pArray[lVar13] + 0x30) * 8);
      pcVar7 = Abc_ObjName(pAVar1);
      sVar5 = strlen(pcVar7);
      iVar14 = (int)sVar5 + 1;
      if (iVar15 == 0) {
LAB_002e35d7:
        iVar15 = 0;
      }
      else if (0x4b < iVar17 + iVar14) {
        fwrite(" \n",2,1,__stream);
        iVar17 = 0;
        goto LAB_002e35d7;
      }
      pcVar7 = Abc_ObjName(pAVar1);
      fprintf(__stream," %s",pcVar7);
      iVar17 = iVar17 + iVar14;
      iVar15 = iVar15 + 1;
      lVar13 = lVar13 + 1;
      pVVar9 = pNtk->vCis;
    } while (lVar13 < pVVar9->nSize);
  }
  fwrite(";\n",2,1,__stream);
  fwrite("OUTORDER =",10,1,__stream);
  pVVar9 = pNtk->vCos;
  if (0 < pVVar9->nSize) {
    iVar17 = 10;
    lVar13 = 0;
    iVar15 = 0;
    do {
      pAVar1 = *(Abc_Obj_t **)
                (*(long *)(*(long *)(*pVVar9->pArray[lVar13] + 0x20) + 8) +
                (long)**(int **)((long)pVVar9->pArray[lVar13] + 0x20) * 8);
      pcVar7 = Abc_ObjName(pAVar1);
      sVar5 = strlen(pcVar7);
      iVar14 = (int)sVar5 + 1;
      if (iVar15 == 0) {
LAB_002e36c1:
        iVar15 = 0;
      }
      else if (0x4b < iVar17 + iVar14) {
        fwrite(" \n",2,1,__stream);
        iVar17 = 0;
        goto LAB_002e36c1;
      }
      pcVar7 = Abc_ObjName(pAVar1);
      fprintf(__stream," %s",pcVar7);
      iVar17 = iVar17 + iVar14;
      iVar15 = iVar15 + 1;
      lVar13 = lVar13 + 1;
      pVVar9 = pNtk->vCos;
    } while (lVar13 < pVVar9->nSize);
  }
  fwrite(";\n",2,1,__stream);
  vLevels = (Vec_Vec_t *)malloc(0x10);
  vLevels->nCap = 10;
  vLevels->nSize = 0;
  ppvVar8 = (void **)malloc(0x50);
  vLevels->pArray = ppvVar8;
  p = Extra_ProgressBarStart((FILE *)_stdout,pNtk->vObjs->nSize);
  pVVar9 = pNtk->vObjs;
  if (0 < pVVar9->nSize) {
    lVar13 = 0;
    do {
      plVar2 = (long *)pVVar9->pArray[lVar13];
      if ((plVar2 != (long *)0x0) && ((*(uint *)((long)plVar2 + 0x14) & 0xf) == 7)) {
        if ((p == (ProgressBar *)0x0) || (p->nItemsNext <= lVar13)) {
          Extra_ProgressBarUpdate_int(p,(int)lVar13,(char *)0x0);
        }
        pcVar7 = Abc_ObjName(*(Abc_Obj_t **)
                              (*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                              (long)*(int *)plVar2[6] * 8));
        fprintf(__stream,"%s = ",pcVar7);
        if (0 < *(int *)((long)plVar2 + 0x1c)) {
          lVar11 = 0;
          do {
            pcVar7 = Abc_ObjName(*(Abc_Obj_t **)
                                  (*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                  (long)*(int *)(plVar2[4] + lVar11 * 4) * 8));
            pHVar10 = Hop_IthVar((Hop_Man_t *)pNtk->pManFunc,(int)lVar11);
            (pHVar10->field_0).pData = pcVar7;
            lVar11 = lVar11 + 1;
          } while (lVar11 < *(int *)((long)plVar2 + 0x1c));
        }
        Hop_ObjPrintEqn((FILE *)__stream,(Hop_Obj_t *)plVar2[7],vLevels,0);
        fwrite(";\n",2,1,__stream);
      }
      lVar13 = lVar13 + 1;
      pVVar9 = pNtk->vObjs;
    } while (lVar13 < pVVar9->nSize);
  }
  Extra_ProgressBarStop(p);
  if (0 < vLevels->nSize) {
    lVar13 = 0;
    do {
      __ptr = vLevels->pArray[lVar13];
      if (__ptr != (void *)0x0) {
        if (*(void **)((long)__ptr + 8) != (void *)0x0) {
          free(*(void **)((long)__ptr + 8));
          *(undefined8 *)((long)__ptr + 8) = 0;
        }
        free(__ptr);
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < vLevels->nSize);
  }
  if (vLevels->pArray != (void **)0x0) {
    free(vLevels->pArray);
    vLevels->pArray = (void **)0x0;
  }
  free(vLevels);
  fputc(10,__stream);
  fclose(__stream);
  return;
}

Assistant:

void Io_WriteEqn( Abc_Ntk_t * pNtk, char * pFileName )
{
    FILE * pFile;

    assert( Abc_NtkIsAigNetlist(pNtk) );
    if ( Abc_NtkLatchNum(pNtk) > 0 )
        printf( "Warning: only combinational portion is being written.\n" );

    // check that the names are fine for the EQN format
    if ( !Io_NtkWriteEqnCheck(pNtk) )
        return;

    // start the output stream
    pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Io_WriteEqn(): Cannot open the output file \"%s\".\n", pFileName );
        return;
    }
    fprintf( pFile, "# Equations for \"%s\" written by ABC on %s\n", pNtk->pName, Extra_TimeStamp() );

    // write the equations for the network
    Io_NtkWriteEqnOne( pFile, pNtk );
	fprintf( pFile, "\n" );
	fclose( pFile );
}